

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O2

uint CustomPNGDeflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                     LodePNGCompressSettings *settings)

{
  byte *pbVar1;
  uchar bp;
  ZopfliOptions options;
  
  pbVar1 = (byte *)settings->custom_context;
  bp = '\0';
  ZopfliInitOptions(&options);
  options.verbose = (int)*pbVar1;
  options.numiterations = *(int *)(pbVar1 + 0x44);
  ZopfliDeflate(&options,2,1,in,insize,&bp,out,outsize);
  return 0;
}

Assistant:

unsigned CustomPNGDeflate(unsigned char** out, size_t* outsize,
                          const unsigned char* in, size_t insize,
                          const LodePNGCompressSettings* settings) {
  const ZopfliPNGOptions* png_options =
      static_cast<const ZopfliPNGOptions*>(settings->custom_context);
  unsigned char bp = 0;
  ZopfliOptions options;
  ZopfliInitOptions(&options);

  options.verbose = png_options->verbose;
  options.numiterations = png_options->num_iterations;

  ZopfliDeflate(&options, 2 /* Dynamic */, 1, in, insize, &bp, out, outsize);

  return 0;  // OK
}